

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

void __thiscall r_exec::MkActChg::MkActChg(MkActChg *this,Mem *m,Code *object,double value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Atom local_48 [4];
  Atom local_44 [4];
  Atom local_40 [16];
  Atom local_30 [6];
  short local_2a;
  double dStack_28;
  uint16_t write_index;
  double value_local;
  Code *object_local;
  Mem *m_local;
  MkActChg *this_local;
  
  dStack_28 = value;
  value_local = (double)object;
  object_local = (Code *)m;
  m_local = (Mem *)this;
  LObject::LObject(&this->super_LObject,m);
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__MkActChg_002eabe8;
  local_2a = 0;
  r_code::Atom::Marker((ushort)local_30,(uchar)Opcodes::MkActChg);
  local_2a = local_2a + 1;
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_30);
  r_code::Atom::~Atom(local_30);
  r_code::Atom::RPointer((ushort)local_40);
  local_2a = local_2a + 1;
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_40);
  r_code::Atom::~Atom(local_40);
  r_code::Atom::Float((float)dStack_28);
  local_2a = local_2a + 1;
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_44);
  r_code::Atom::~Atom(local_44);
  r_code::Atom::Float(0.0);
  local_2a = local_2a + 1;
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar1),local_48);
  r_code::Atom::~Atom(local_48);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[8])(this,0,value_local);
  return;
}

Assistant:

MkActChg::MkActChg(r_code::Mem *m, Code *object, double value): LObject(m)
{
    uint16_t write_index = 0;
    code(write_index++) = r_code::Atom::Marker(Opcodes::MkActChg, 3);
    code(write_index++) = r_code::Atom::RPointer(0); // object.
    code(write_index++) = r_code::Atom::Float(value); // change.
    code(write_index++) = r_code::Atom::Float(0); // psln_thr.
    set_reference(0, object);
}